

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3.cpp
# Opt level: O0

void __thiscall
CTPNCodeBody::build_debug_table(CTPNCodeBody *this,ulong start_ofs,int include_lines)

{
  int iVar1;
  size_t __n;
  tcgen_line_t *ptVar2;
  ulong uVar3;
  size_t in_RCX;
  size_t __n_00;
  int in_EDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *extraout_RDX_04;
  void *pvVar4;
  void *extraout_RDX_05;
  bool bVar5;
  write_local_to_debug_frame_ctx cbctx_1;
  int j_2;
  ulong count_ofs;
  CTcPrsSymtab *par;
  ulong index_ofs;
  ulong post_ptr_ofs;
  int j_1;
  CTcPrsSymtab *fr;
  tcgen_line_t *rec;
  int j;
  write_local_to_debug_frame_ctx cbctx;
  int frame_cnt;
  CTcPrsSymtab *frame;
  size_t i;
  _func_void_void_ptr_CTcSymbol_ptr *in_stack_fffffffffffffef8;
  CTcDataStream *in_stack_ffffffffffffff00;
  CTcCodeStream *in_stack_ffffffffffffff08;
  CTcCodeStream *in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  CTcGenTarg *in_stack_ffffffffffffff20;
  int local_74;
  CTcPrsSymtab *local_68;
  int local_4c;
  CTcPrsSymtab *local_48;
  int local_38;
  CTcPrsSymtab *local_28;
  ulong local_20;
  uint val;
  
  for (local_28 = CTcCodeStream::get_first_frame(G_cs); local_28 != (CTcPrsSymtab *)0x0;
      local_28 = CTcPrsSymtab::get_list_next(local_28)) {
    CTcPrsSymtab::enum_entries
              ((CTcPrsSymtab *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(void *)0x286b61)
    ;
    CTcPrsSymtab::set_list_index(local_28,0);
  }
  if (in_EDX != 0) {
    CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
    CTcDataStream::write2_at
              (&in_stack_ffffffffffffff10->super_CTcDataStream,(ulong)in_stack_ffffffffffffff08,
               (uint)((ulong)in_stack_ffffffffffffff00 >> 0x20));
    pvVar4 = extraout_RDX;
    for (local_38 = G_sizes.dbg_hdr; 0 < local_38; local_38 = local_38 + -1) {
      CTcDataStream::write(&G_cs->super_CTcDataStream,0,pvVar4,in_RCX);
      pvVar4 = extraout_RDX_00;
    }
    CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
    CTcGenTarg::add_debug_line_table
              (in_stack_ffffffffffffff20,
               CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    if (in_EDX == 0) {
      CTcDataStream::write2
                (in_stack_ffffffffffffff00,(uint)((ulong)in_stack_fffffffffffffef8 >> 0x20));
    }
    else {
      CTcCodeStream::get_line_rec_count(G_cs);
      CTcDataStream::write2
                (in_stack_ffffffffffffff00,(uint)((ulong)in_stack_fffffffffffffef8 >> 0x20));
      for (local_20 = 0; __n = CTcCodeStream::get_line_rec_count(G_cs), local_20 < __n;
          local_20 = local_20 + 1) {
        ptVar2 = CTcCodeStream::get_line_rec(G_cs,local_20);
        CTcDataStream::write2
                  (in_stack_ffffffffffffff00,(uint)((ulong)in_stack_fffffffffffffef8 >> 0x20));
        CTcDataStream::write2
                  (in_stack_ffffffffffffff00,(uint)((ulong)in_stack_fffffffffffffef8 >> 0x20));
        CTcDataStream::write4
                  (&in_stack_ffffffffffffff10->super_CTcDataStream,(ulong)in_stack_ffffffffffffff08)
        ;
        local_48 = ptVar2->frame;
        while( true ) {
          bVar5 = false;
          if (local_48 != (CTcPrsSymtab *)0x0) {
            iVar1 = CTcPrsSymtab::get_list_index(local_48);
            bVar5 = iVar1 == 0;
          }
          if (!bVar5) break;
          local_48 = CTcPrsSymtab::get_parent(local_48);
        }
        if (local_48 != (CTcPrsSymtab *)0x0) {
          CTcPrsSymtab::get_list_index(local_48);
        }
        CTcDataStream::write2
                  (in_stack_ffffffffffffff00,(uint)((ulong)in_stack_fffffffffffffef8 >> 0x20));
        pvVar4 = extraout_RDX_01;
        for (local_4c = G_sizes.dbg_line + -10; 0 < local_4c; local_4c = local_4c + -1) {
          CTcDataStream::write(&G_cs->super_CTcDataStream,0,pvVar4,__n);
          pvVar4 = extraout_RDX_02;
        }
      }
    }
    uVar3 = CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
    val = (uint)(uVar3 >> 0x20);
    CTcDataStream::write2
              (in_stack_ffffffffffffff00,(uint)((ulong)in_stack_fffffffffffffef8 >> 0x20));
    CTcDataStream::write2
              (in_stack_ffffffffffffff00,(uint)((ulong)in_stack_fffffffffffffef8 >> 0x20));
    CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
    __n_00 = 0;
    for (local_28 = CTcCodeStream::get_first_frame(G_cs); local_28 != (CTcPrsSymtab *)0x0;
        local_28 = CTcPrsSymtab::get_list_next(local_28)) {
      iVar1 = CTcPrsSymtab::get_list_index(local_28);
      if (iVar1 != 0) {
        CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
        CTcDataStream::write2_at
                  (&in_stack_ffffffffffffff10->super_CTcDataStream,(ulong)in_stack_ffffffffffffff08,
                   (uint)((ulong)in_stack_ffffffffffffff00 >> 0x20));
        local_68 = CTcPrsSymtab::get_parent(local_28);
        while( true ) {
          bVar5 = false;
          if (local_68 != (CTcPrsSymtab *)0x0) {
            iVar1 = CTcPrsSymtab::get_list_index(local_68);
            bVar5 = iVar1 == 0;
          }
          if (!bVar5) break;
          local_68 = CTcPrsSymtab::get_parent(local_68);
        }
        if (local_68 != (CTcPrsSymtab *)0x0) {
          CTcPrsSymtab::get_list_index(local_68);
        }
        CTcDataStream::write2
                  (in_stack_ffffffffffffff00,(uint)((ulong)in_stack_fffffffffffffef8 >> 0x20));
        CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
        CTcDataStream::write2
                  (in_stack_ffffffffffffff00,(uint)((ulong)in_stack_fffffffffffffef8 >> 0x20));
        pvVar4 = extraout_RDX_03;
        if (7 < G_sizes.dbg_frame) {
          in_stack_ffffffffffffff08 = G_cs;
          CTcPrsSymtab::get_start_ofs(local_28);
          CTcDataStream::write2
                    (in_stack_ffffffffffffff00,(uint)((ulong)in_stack_fffffffffffffef8 >> 0x20));
          in_stack_ffffffffffffff10 = G_cs;
          CTcPrsSymtab::get_end_ofs(local_28);
          CTcDataStream::write2
                    (in_stack_ffffffffffffff00,(uint)((ulong)in_stack_fffffffffffffef8 >> 0x20));
          pvVar4 = extraout_RDX_04;
        }
        for (local_74 = G_sizes.dbg_frame + -8; 0 < local_74; local_74 = local_74 + -1) {
          CTcDataStream::write(&G_cs->super_CTcDataStream,0,pvVar4,__n_00);
          pvVar4 = extraout_RDX_05;
        }
        CTcPrsSymtab::enum_entries
                  ((CTcPrsSymtab *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                   (void *)0x287148);
        CTcDataStream::write2_at
                  (&in_stack_ffffffffffffff10->super_CTcDataStream,(ulong)in_stack_ffffffffffffff08,
                   (uint)((ulong)in_stack_ffffffffffffff00 >> 0x20));
      }
    }
    CTcDataStream::get_ofs(&G_cs->super_CTcDataStream);
    CTcDataStream::write2_at
              (&in_stack_ffffffffffffff10->super_CTcDataStream,(ulong)in_stack_ffffffffffffff08,val)
    ;
    CTcDataStream::write4
              (&in_stack_ffffffffffffff10->super_CTcDataStream,(ulong)in_stack_ffffffffffffff08);
  }
  return;
}

Assistant:

void CTPNCodeBody::build_debug_table(ulong start_ofs, int include_lines)
{
    size_t i;

    /*
     *   Count up the frames that contain local variables.  Frames that
     *   contain no locals can be elided to reduce the size of the file,
     *   since they carry no information.  
     */
    CTcPrsSymtab *frame;
    int frame_cnt;
    for (frame_cnt = 0, frame = G_cs->get_first_frame() ; frame != 0 ;
         frame = frame->get_list_next())
    {
        /* enumerate the entries through our counting callback */
        write_local_to_debug_frame_ctx cbctx;
        cbctx.count = 0;
        cbctx.count_only = TRUE;
        frame->enum_entries(&write_local_to_debug_frame, &cbctx);

        /* check to see if it has any locals */
        if (cbctx.count != 0)
        {
            /* it has locals - renumber it to the current list position */
            ++frame_cnt;
            frame->set_list_index(frame_cnt);
        }
        else
        {
            /* no locals - flag it as empty by setting its list index to 0 */
            frame->set_list_index(0);
        }
    }

    /*
     *   If we're not writing line records, and we don't have any frames with
     *   local variables, skip writing the debug table.  The debug table in
     *   this case is for local variable reflection information only, so if
     *   we don't have any locals, we don't need the table at all.  
     */
    if (!include_lines && frame_cnt == 0)
        return;

    /* fix up the debug record offset in the prolog to point here */
    G_cs->write2_at(start_ofs + 8, G_cs->get_ofs() - start_ofs);

    /*
     *   Write the debug table header.  In the current VM version, this is
     *   empty, so we have nothing to write.  However, if we're dynamically
     *   targeting a newer version, pad out any expected header space with
     *   zeros.  
     */
    for (int j = G_sizes.dbg_hdr ; j > 0 ; --j)
        G_cs->write(0);

    /* 
     *   Add this offset to our list of line records.  If we're creating an
     *   object file, upon re-loading the object file, we'll need to go
     *   through all of the line record tables and fix up the file references
     *   to the final file numbering system at link time, so we need this
     *   memory of where the line record are.  We'll also need to fix up the
     *   local variable name records to point to the consolidated set of
     *   strings in the constant pool.  
     */
    G_cg->add_debug_line_table(G_cs->get_ofs());

    /* if desired, write the source code location ("line") records */
    if (include_lines)
    {
        /* write the number of line records */
        G_cs->write2(G_cs->get_line_rec_count());

        /* write the line records themselves */
        for (i = 0 ; i < G_cs->get_line_rec_count() ; ++i)
        {
            /* get this record */
            tcgen_line_t *rec = G_cs->get_line_rec(i);

            /* write the offset of the statement's first opcode */
            G_cs->write2(rec->ofs);

            /* write the source file ID and line number */
            G_cs->write2(rec->source_id);
            G_cs->write4(rec->source_line);

            /* 
             *   Get the frame for the line record.  If the frame is empty,
             *   use the parent frame instead, since we omit empty frames.
             */
            CTcPrsSymtab *fr = rec->frame;
            while (fr != 0 && fr->get_list_index() == 0)
                fr = fr->get_parent();

            /* write the frame ID */
            G_cs->write2(fr == 0 ? 0 : fr->get_list_index());

            /* add any padding expected in the target VM version */
            for (int j = G_sizes.dbg_line - 10 ; j > 0 ; --j)
                G_cs->write(0);
        }
    }
    else
    {
        /* no line records - write zero as the line count */
        G_cs->write2(0);
    }

    /* 
     *   write a placeholder pointer to the next byte after the end of the
     *   frame table 
     */
    ulong post_ptr_ofs = G_cs->get_ofs();
    G_cs->write2(0);

    /* write the frame count */
    G_cs->write2(frame_cnt);

    /* 
     *   Write a placeholder frame index table.  We will come back and fix up
     *   this table as we actually write out the frames, but we don't
     *   actually know how big the individual frame records will be yet, so
     *   we can only write placeholders for them for now.  First, note where
     *   the frame index table begins.  
     */
    ulong index_ofs = G_cs->get_ofs();

    /* write the placeholder index entries */
    for (i = 0 ; i < (size_t)frame_cnt ; ++i)
        G_cs->write2(0);

    /* write the individual frames */
    for (frame = G_cs->get_first_frame() ; frame != 0 ;
         frame = frame->get_list_next())
    {
        /* 
         *   if this frame has a zero list index, it means that it contains
         *   no writable symbols, so we can omit it from the debug table 
         */
        if (frame->get_list_index() == 0)
            continue;

        /* 
         *   go back and fill in the correct offset (from the entry itself)
         *   in the index table entry for this frame 
         */
        G_cs->write2_at(index_ofs, G_cs->get_ofs() - index_ofs);

        /* move on to the next index entry */
        index_ofs += 2;

        /* 
         *   Get the effective parent.  If the actual parent doesn't have a
         *   list index, it's empty, so we're not writing it.  Find the
         *   nearest parent of the parent that we'll actually write, and use
         *   that as our effective parent. 
         */
        CTcPrsSymtab *par;
        for (par = frame->get_parent() ;
             par != 0 && par->get_list_index() == 0 ;
             par = par->get_parent()) ;

        /* write the ID of the enclosing frame */
        G_cs->write2(par != 0 ? par->get_list_index() : 0);

        /* 
         *   write a placeholder for the count of the number of entries in
         *   the frame, and remember where the placeholder is so we can come
         *   back and fix it up later 
         */
        ulong count_ofs = G_cs->get_ofs();
        G_cs->write2(0);

        /* add the bytecode range covered, if there's room in the format */
        if (G_sizes.dbg_frame >= 8)
        {
            G_cs->write2(frame->get_start_ofs());
            G_cs->write2(frame->get_end_ofs());
        }

        /* pad out any extra space */
        for (int j = G_sizes.dbg_frame - 8 ; j > 0 ; --j)
            G_cs->write(0);

        /* initialize the enumeration callback context */
        write_local_to_debug_frame_ctx cbctx;
        cbctx.count = 0;
        cbctx.count_only = FALSE;

        /* write this frame table's entries */
        frame->enum_entries(&write_local_to_debug_frame, &cbctx);

        /* go back and fix up the symbol count */
        G_cs->write2_at(count_ofs, cbctx.count);
    }

    /* 
     *   go back and fill in the post-pointer offset - this is a pointer to
     *   the next byte after the end of the frame table; write the offset
     *   from the post-pointer field to the current location 
     */
    G_cs->write2_at(post_ptr_ofs, G_cs->get_ofs() - post_ptr_ofs);

    /* 
     *   write the required UINT4 zero value after the frame table - this
     *   is a placeholder for future expansion (if we add more information
     *   to the debug table later, this value will be non-zero to indicate
     *   the presence of the additional information) 
     */
    G_cs->write4(0);
}